

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O2

void __thiscall Lodtalk::VMContext::VMContext(VMContext *this)

{
  (this->instancedClassFactories)._M_h._M_buckets =
       &(this->instancedClassFactories)._M_h._M_single_bucket;
  (this->instancedClassFactories)._M_h._M_bucket_count = 1;
  (this->instancedClassFactories)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->instancedClassFactories)._M_h._M_element_count = 0;
  (this->instancedClassFactories)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->instancedClassFactories)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->instancedClassFactories)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->numberedPrimitives)._M_h._M_buckets = &(this->numberedPrimitives)._M_h._M_single_bucket;
  (this->numberedPrimitives)._M_h._M_bucket_count = 1;
  (this->numberedPrimitives)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->numberedPrimitives)._M_h._M_element_count = 0;
  (this->numberedPrimitives)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->numberedPrimitives)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->numberedPrimitives)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  initialize(this);
  return;
}

Assistant:

VMContext::VMContext()
{
    initialize();
}